

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_> *
__thiscall
slang::ast::Compilation::getPackages
          (vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  uint uVar1;
  ushort uVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  ulong uVar3;
  _Cat _Var4;
  char_pointer puVar5;
  char_pointer puVar6;
  const_iterator __position;
  ulong uVar7;
  table_element_pointer ppVar8;
  char_pointer puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  iterator iVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar12 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
           ::begin(&(this->packageMap).table_);
  if (iVar12.p_ == (table_element_pointer)0x0) {
    return __return_storage_ptr__;
  }
LAB_0035a1cb:
  do {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(__return_storage_ptr__->
                  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
    while (uVar3 = uVar7, 0 < (long)uVar3) {
      uVar7 = uVar3 >> 1;
      __y._M_len = (__position._M_current[uVar7]->super_Symbol).name._M_len;
      __y._M_str = (__position._M_current[uVar7]->super_Symbol).name._M_str;
      _Var4 = std::operator<=><char,std::char_traits<char>>((iVar12.p_)->first,__y);
      if (-1 < _Var4._M_value) {
        __position._M_current = __position._M_current + uVar7 + 1;
        uVar7 = ~uVar7 + uVar3;
      }
    }
    std::
    vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>::
    insert(__return_storage_ptr__,__position,(value_type *)&(iVar12.p_)->second);
    puVar6 = iVar12.pc_ + 0x12;
    puVar9 = iVar12.pc_ + 2;
    while( true ) {
      puVar5 = puVar9;
      puVar9 = iVar12.pc_;
      ppVar8 = iVar12.p_ + 1;
      if (((uint)iVar12.pc_ & 0xf) == 0xe) break;
      iVar12.p_ = ppVar8;
      iVar12.pc_ = puVar9 + 1;
      puVar6 = puVar6 + 1;
      puVar9 = puVar5 + 1;
      if (puVar5[-1] != '\0') goto code_r0x0035a250;
    }
    auVar10[0] = -(*puVar5 == '\0');
    auVar10[1] = -(puVar5[1] == '\0');
    auVar10[2] = -(puVar5[2] == '\0');
    auVar10[3] = -(puVar5[3] == '\0');
    auVar10[4] = -(puVar5[4] == '\0');
    auVar10[5] = -(puVar5[5] == '\0');
    auVar10[6] = -(puVar5[6] == '\0');
    auVar10[7] = -(puVar5[7] == '\0');
    auVar10[8] = -(puVar5[8] == '\0');
    auVar10[9] = -(puVar5[9] == '\0');
    auVar10[10] = -(puVar5[10] == '\0');
    auVar10[0xb] = -(puVar5[0xb] == '\0');
    auVar10[0xc] = -(puVar5[0xc] == '\0');
    auVar10[0xd] = -(puVar5[0xd] == '\0');
    auVar10[0xe] = -(puVar5[0xe] == '\0');
    auVar10[0xf] = -(puVar5[0xf] == '\0');
    uVar2 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
    while (uVar2 == 0x7fff) {
      ppVar8 = ppVar8 + 0xf;
      auVar11[0] = -(*puVar6 == '\0');
      auVar11[1] = -(puVar6[1] == '\0');
      auVar11[2] = -(puVar6[2] == '\0');
      auVar11[3] = -(puVar6[3] == '\0');
      auVar11[4] = -(puVar6[4] == '\0');
      auVar11[5] = -(puVar6[5] == '\0');
      auVar11[6] = -(puVar6[6] == '\0');
      auVar11[7] = -(puVar6[7] == '\0');
      auVar11[8] = -(puVar6[8] == '\0');
      auVar11[9] = -(puVar6[9] == '\0');
      auVar11[10] = -(puVar6[10] == '\0');
      auVar11[0xb] = -(puVar6[0xb] == '\0');
      auVar11[0xc] = -(puVar6[0xc] == '\0');
      auVar11[0xd] = -(puVar6[0xd] == '\0');
      auVar11[0xe] = -(puVar6[0xe] == '\0');
      auVar11[0xf] = -(puVar6[0xf] == '\0');
      puVar5 = puVar6;
      puVar6 = puVar6 + 0x10;
      uVar2 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe;
    }
    uVar1 = 0;
    if ((uVar2 ^ 0x7fff) != 0) {
      for (; ((uVar2 ^ 0x7fff) >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    if (puVar5[uVar1] == '\x01') {
      return __return_storage_ptr__;
    }
    iVar12.p_ = ppVar8 + uVar1;
    iVar12.pc_ = puVar5 + uVar1;
  } while( true );
code_r0x0035a250:
  if (puVar5[-1] == '\x01') {
    return __return_storage_ptr__;
  }
  iVar12.pc_ = puVar5 + -1;
  goto LAB_0035a1cb;
}

Assistant:

std::vector<const PackageSymbol*> Compilation::getPackages() const {
    std::vector<const PackageSymbol*> result;
    for (auto& [name, pkg] : packageMap) {
        result.insert(
            std::ranges::upper_bound(result, name, {}, [](auto item) { return item->name; }), pkg);
    }
    return result;
}